

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O3

void __thiscall
GEO::AdaptiveKdTree::split_kd_node
          (AdaptiveKdTree *this,index_t b,index_t e,double *bbox_min,double *bbox_max,index_t *m,
          coord_index_t *cut_dim,double *cut_val)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  index_t br2;
  index_t br1;
  uint local_58;
  uint local_54;
  double local_50;
  double local_48;
  double local_40;
  index_t *local_38;
  
  uVar1 = (ulong)b;
  uVar3 = (ulong)(byte)(this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc;
  if (uVar3 == 0) {
    dVar7 = -0.999;
  }
  else {
    uVar4 = 0;
    dVar8 = -1.0;
    do {
      dVar7 = bbox_max[uVar4] - bbox_min[uVar4];
      if (bbox_max[uVar4] - bbox_min[uVar4] <= dVar8) {
        dVar7 = dVar8;
      }
      uVar4 = uVar4 + 1;
      dVar8 = dVar7;
    } while (uVar3 != uVar4);
    dVar7 = dVar7 * 0.999;
  }
  *cut_dim = '\0';
  bVar5 = (this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc;
  if (bVar5 == 0) {
    uVar6 = 0;
  }
  else {
    dVar8 = -1.0;
    uVar3 = 0;
    uVar4 = 0;
    do {
      if ((b < e) && (dVar7 <= bbox_max[uVar4] - bbox_min[uVar4])) {
        uVar2 = uVar1;
        dVar9 = -1.79769313486232e+308;
        dVar11 = 1.79769313486232e+308;
        do {
          dVar10 = (this->super_KdTree).super_NearestNeighborSearch.points_
                   [uVar4 + (this->super_KdTree).point_index_.
                            super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            .
                            super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar2] *
                            (this->super_KdTree).super_NearestNeighborSearch.stride_];
          dVar12 = dVar10;
          if (dVar11 <= dVar10) {
            dVar12 = dVar11;
          }
          if (dVar10 <= dVar9) {
            dVar10 = dVar9;
          }
          uVar2 = uVar2 + 1;
          dVar9 = dVar10;
          dVar11 = dVar12;
        } while (e != uVar2);
        if (dVar8 < dVar10 - dVar12) {
          *cut_dim = (coord_index_t)uVar4;
          bVar5 = (this->super_KdTree).super_NearestNeighborSearch.super_Counted.field_0xc;
          uVar3 = uVar4 & 0xffffffff;
          dVar8 = dVar10 - dVar12;
        }
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < bVar5);
    uVar6 = (uint)uVar3 & 0xff;
  }
  local_40 = (*(double *)((long)bbox_min + (ulong)(uVar6 * 8)) +
             *(double *)((long)bbox_max + (ulong)(uVar6 * 8))) * 0.5;
  if (e < b || e - b == 0) {
    local_50 = -1.79769313486232e+308;
    local_48 = 1.79769313486232e+308;
  }
  else {
    local_50 = -1.79769313486232e+308;
    local_48 = 1.79769313486232e+308;
    uVar3 = uVar1;
    do {
      dVar7 = *(double *)
               ((long)(this->super_KdTree).super_NearestNeighborSearch.points_ +
               (ulong)((this->super_KdTree).point_index_.
                       super_vector<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       .
                       super__Vector_base<unsigned_int,_GEO::Memory::aligned_allocator<unsigned_int,_64>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar3] *
                      (this->super_KdTree).super_NearestNeighborSearch.stride_) * 8 +
               (ulong)(uVar6 << 3));
      dVar8 = dVar7;
      if (local_48 <= dVar7) {
        dVar8 = local_48;
      }
      local_48 = dVar8;
      if (dVar7 <= local_50) {
        dVar7 = local_50;
      }
      local_50 = dVar7;
      uVar3 = uVar3 + 1;
    } while (e != uVar3);
  }
  *cut_val = local_40;
  dVar7 = local_48;
  if ((local_40 < local_48) || (dVar8 = local_40, dVar7 = local_50, local_50 < local_40)) {
    dVar8 = dVar7;
    *cut_val = dVar8;
  }
  local_38 = m;
  (*(this->super_KdTree).super_NearestNeighborSearch.super_Counted._vptr_Counted[0xf])
            (dVar8,this,uVar1,(ulong)e,(ulong)*cut_dim,&local_54,&local_58);
  uVar6 = (e - b >> 1) + b;
  *local_38 = uVar6;
  if (local_48 <= local_40) {
    if (local_40 <= local_50) {
      if ((local_54 <= uVar6) && (local_54 = local_58, uVar6 <= local_58)) {
        return;
      }
    }
    else {
      local_54 = e - 1;
    }
  }
  else {
    local_54 = b + 1;
  }
  *local_38 = local_54;
  return;
}

Assistant:

void AdaptiveKdTree::split_kd_node(
        index_t b, index_t e,
	double* bbox_min, double* bbox_max,
	index_t& m, coord_index_t& cut_dim, double& cut_val	
    ) {
	// Like "sliding midpoint split" in ANN.
	
	const double ERR=0.001;
	
	// Find length of longest box size
	double max_length = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    max_length = std::max(max_length, length);
	}

	// Cutting coordinate
	cut_dim=0;
	
	// Find long side with most spread
	double max_spread = -1.0;
	for(coord_index_t d=0; d<dimension(); ++d) {
	    double length = bbox_max[d] - bbox_min[d];
	    // Is it among longest ?
	    if(length >= (1.0 - ERR)*max_length) {
		double spr = spread(b, e, d);
		if(spr > max_spread) {
		    max_spread = spr;
		    cut_dim = d;
		}
	    }
	}

	double ideal_cut_val = 0.5*(bbox_min[cut_dim] + bbox_max[cut_dim]);

	double coord_min, coord_max;
	get_minmax(b, e, cut_dim, coord_min, coord_max);

	cut_val = ideal_cut_val;
	
	// Make it slide if need be.
	if(ideal_cut_val < coord_min) {
	    cut_val = coord_min;
	} else if (ideal_cut_val > coord_max) {
	    cut_val = coord_max;
	}
	
	index_t br1,br2;
	plane_split(b,e,cut_dim,cut_val,br1,br2);

	index_t m0 = b + (e-b)/2;
	m = m0;
	
	if(ideal_cut_val < coord_min) {
	    m = b+1;
	} else if(ideal_cut_val > coord_max) {
	    m = e-1;
	} else if(br1 > m0) {
	    m = br1;
	} else if(br2 < m0) {
	    m = br2;
	} 
    }